

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O1

void jpc_qmfb_split_row(jpc_fix_t *a,uint numcols,uint parity)

{
  undefined1 *ptr;
  int iVar1;
  long lVar2;
  jpc_fix_t *pjVar3;
  uint uVar4;
  jpc_fix_t splitbuf [4096];
  undefined1 local_8028 [32776];
  
  ptr = local_8028;
  uVar4 = numcols + 1;
  if ((0x2001 < uVar4) &&
     (ptr = (undefined1 *)jas_alloc2((ulong)(uVar4 >> 1),8), ptr == (undefined1 *)0x0)) {
    abort();
  }
  if (1 < numcols) {
    uVar4 = uVar4 - parity >> 1;
    if (numcols != uVar4) {
      lVar2 = 0;
      pjVar3 = a + (1 - parity);
      do {
        *(jpc_fix_t *)(ptr + lVar2 * 8) = *pjVar3;
        pjVar3 = pjVar3 + 2;
        lVar2 = lVar2 + 1;
      } while (numcols - uVar4 != (int)lVar2);
    }
    iVar1 = uVar4 - (parity == 0);
    if (iVar1 != 0) {
      lVar2 = 0;
      do {
        *(undefined8 *)((long)(a + (1 - parity)) + lVar2) =
             *(undefined8 *)((long)a + lVar2 * 2 + (ulong)(2 - parity) * 8);
        lVar2 = lVar2 + 8;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    if (numcols != uVar4) {
      lVar2 = 0;
      do {
        a[(ulong)uVar4 + lVar2] = *(jpc_fix_t *)(ptr + lVar2 * 8);
        lVar2 = lVar2 + 1;
      } while (numcols - uVar4 != (int)lVar2);
    }
  }
  if (ptr != local_8028) {
    jas_free(ptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_row(jpc_fix_t *a, unsigned numcols, unsigned parity)
{
	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE];
	jpc_fix_t *buf = splitbuf;
	register jpc_fix_t *srcptr;
	register jpc_fix_t *dstptr;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numcols, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc2(bufsize, sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numcols >= 2) {
		const unsigned hstartcol = (numcols + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartcol : (numcols - hstartcol);
		const unsigned m = numcols - hstartcol;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[1 - parity];
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[1 - parity];
		srcptr = &a[2 - parity];
		for (unsigned n = numcols - m - (!parity); n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartcol];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			++srcptr;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}